

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapOrSetDataList.h
# Opt level: O0

MapOrSetDataNode<void_*> * __thiscall
Js::MapOrSetDataList<void_*>::Append(MapOrSetDataList<void_*> *this,void **data,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  Recycler *alloc;
  MapOrSetDataNode<void_*> *pMVar3;
  MapOrSetDataNode<void_*> **ppMVar4;
  undefined4 *puVar5;
  MapOrSetDataNode<void_*> *this_00;
  TrackAllocData local_50;
  MapOrSetDataNode<void_*> *local_28;
  MapOrSetDataNode<void_*> *newNode;
  Recycler *recycler_local;
  void **data_local;
  MapOrSetDataList<void_*> *this_local;
  
  newNode = (MapOrSetDataNode<void_*> *)recycler;
  recycler_local = (Recycler *)data;
  data_local = (void **)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&MapOrSetDataNode<void*>::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/MapOrSetDataList.h"
             ,0x92);
  alloc = Memory::Recycler::TrackAllocInfo(recycler,&local_50);
  pMVar3 = (MapOrSetDataNode<void_*> *)new<Memory::Recycler>(0x18,alloc,0x43c4b0);
  MapOrSetDataNode<void_*>::MapOrSetDataNode(pMVar3,(void **)recycler_local);
  local_28 = pMVar3;
  ppMVar4 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                      ((WriteBarrierPtr *)&this->last);
  if (*ppMVar4 == (MapOrSetDataNode<void_*> *)0x0) {
    ppMVar4 = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__((WriteBarrierPtr *)this);
    if (*ppMVar4 != (MapOrSetDataNode<void_*> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/MapOrSetDataList.h"
                                  ,0x96,"(first == nullptr)","first == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::operator=(&this->first,local_28);
    Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::operator=(&this->last,local_28);
  }
  else {
    Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::operator=(&local_28->prev,&this->last);
    pMVar3 = local_28;
    this_00 = Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::operator->(&this->last);
    Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::operator=(&this_00->next,pMVar3);
    Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::operator=(&this->last,local_28);
  }
  return local_28;
}

Assistant:

MapOrSetDataNode<TData>* Append(TData& data, Recycler* recycler)
        {
            // Must allocate with the recycler so that iterators can continue
            // to point to removed nodes.  That is, cannot delete nodes when
            // they are removed.  Reference counting would also work.
            MapOrSetDataNode<TData>* newNode = RecyclerNew(recycler, MapOrSetDataNode<TData>, data);

            if (last == nullptr)
            {
                Assert(first == nullptr);
                first = newNode;
                last = newNode;
            }
            else
            {
                newNode->prev = last;
                last->next = newNode;
                last = newNode;
            }

            return newNode;
        }